

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.h
# Opt level: O0

size_t GetDataSize<DirectoryString>(vector<DirectoryString,_std::allocator<DirectoryString>_> *in)

{
  size_type sVar1;
  DerBase *this;
  size_t sVar2;
  undefined4 local_1c;
  size_t sStack_18;
  uint i;
  size_t ret;
  vector<DirectoryString,_std::allocator<DirectoryString>_> *in_local;
  
  sStack_18 = 0;
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<DirectoryString,_std::allocator<DirectoryString>_>::size(in);
    if (sVar1 <= local_1c) break;
    this = (DerBase *)
           std::vector<DirectoryString,_std::allocator<DirectoryString>_>::operator[]
                     (in,(ulong)local_1c);
    sVar2 = DerBase::EncodedSize(this);
    sStack_18 = sVar2 + sStack_18;
    local_1c = local_1c + 1;
  }
  return sStack_18;
}

Assistant:

size_t GetDataSize(std::vector<T>& in) 
{
	size_t ret = 0;
	for (unsigned int i = 0; i < in.size(); ++i)
	{
		ret += in[i].EncodedSize();
	}

	return ret;
}